

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O2

int mbedtls_ctr_drbg_reseed(mbedtls_ctr_drbg_context *ctx,uchar *additional,size_t len)

{
  int iVar1;
  size_t sVar2;
  uchar seed [384];
  
  sVar2 = ctx->entropy_len;
  if (sVar2 + len < 0x181) {
    memset(seed,0,0x180);
    iVar1 = (*ctx->f_entropy)(ctx->p_entropy,seed,sVar2);
    if (iVar1 == 0) {
      sVar2 = ctx->entropy_len;
      if (len != 0 && additional != (uchar *)0x0) {
        memcpy(seed + sVar2,additional,len);
        sVar2 = sVar2 + len;
      }
      block_cipher_df(seed,seed,sVar2);
      ctr_drbg_update_internal(ctx,seed);
      ctx->reseed_counter = 1;
      iVar1 = 0;
    }
    else {
      iVar1 = -0x34;
    }
  }
  else {
    iVar1 = -0x38;
  }
  return iVar1;
}

Assistant:

int mbedtls_ctr_drbg_reseed( mbedtls_ctr_drbg_context *ctx,
                     const unsigned char *additional, size_t len )
{
    unsigned char seed[MBEDTLS_CTR_DRBG_MAX_SEED_INPUT];
    size_t seedlen = 0;

    if( ctx->entropy_len + len > MBEDTLS_CTR_DRBG_MAX_SEED_INPUT )
        return( MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG );

    memset( seed, 0, MBEDTLS_CTR_DRBG_MAX_SEED_INPUT );

    /*
     * Gather entropy_len bytes of entropy to seed state
     */
    if( 0 != ctx->f_entropy( ctx->p_entropy, seed,
                             ctx->entropy_len ) )
    {
        return( MBEDTLS_ERR_CTR_DRBG_ENTROPY_SOURCE_FAILED );
    }

    seedlen += ctx->entropy_len;

    /*
     * Add additional data
     */
    if( additional && len )
    {
        memcpy( seed + seedlen, additional, len );
        seedlen += len;
    }

    /*
     * Reduce to 384 bits
     */
    block_cipher_df( seed, seed, seedlen );

    /*
     * Update state
     */
    ctr_drbg_update_internal( ctx, seed );
    ctx->reseed_counter = 1;

    return( 0 );
}